

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_method.cc
# Opt level: O1

bool __thiscall
bssl::tls_set_write_state
          (bssl *this,SSL *ssl,ssl_encryption_level_t level,UniquePtr<SSLAEADContext> *aead_ctx,
          Span<const_unsigned_char> traffic_secret)

{
  long lVar1;
  pointer __p;
  bool bVar2;
  int iVar3;
  undefined4 in_register_00000014;
  undefined8 *puVar4;
  
  puVar4 = (undefined8 *)CONCAT44(in_register_00000014,level);
  bVar2 = tls_flush_pending_hs_data((SSL *)this);
  if (bVar2) {
    iVar3 = SSL_is_quic((SSL *)this);
    if (iVar3 != 0) {
      if (((*(long *)(*(long *)(this + 0x30) + 0x118) == 0) ||
          ((*(byte *)(*(long *)(*(long *)(this + 0x30) + 0x118) + 0x6ca) & 0x10) == 0)) &&
         (iVar3 = (**(code **)(*(long *)(this + 0x98) + 8))
                            (this,(ulong)ssl & 0xffffffff,*(undefined8 *)*puVar4,aead_ctx,
                             traffic_secret.data_), iVar3 == 0)) goto LAB_0027aeac;
      if ((int)ssl == 1) {
        return true;
      }
      *(int *)(*(long *)(this + 0x30) + 0xcc) = (int)ssl;
    }
    lVar1 = *(long *)(this + 0x30);
    *(undefined8 *)(lVar1 + 8) = 0;
    __p = (pointer)*puVar4;
    *puVar4 = 0;
    std::__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter> *)(lVar1 + 0x110),__p
              );
    bVar2 = true;
  }
  else {
LAB_0027aeac:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool tls_set_write_state(SSL *ssl, ssl_encryption_level_t level,
                                UniquePtr<SSLAEADContext> aead_ctx,
                                Span<const uint8_t> traffic_secret) {
  if (!tls_flush_pending_hs_data(ssl)) {
    return false;
  }

  if (SSL_is_quic(ssl)) {
    if ((ssl->s3->hs == nullptr || !ssl->s3->hs->hints_requested) &&
        !ssl->quic_method->set_write_secret(ssl, level, aead_ctx->cipher(),
                                            traffic_secret.data(),
                                            traffic_secret.size())) {
      return false;
    }

    // QUIC only uses |ssl| for handshake messages, which never use early data
    // keys, so we return without installing anything. This avoids needing to
    // have two secrets active at once in 0-RTT.
    if (level == ssl_encryption_early_data) {
      return true;
    }
    ssl->s3->quic_write_level = level;
  }

  ssl->s3->write_sequence = 0;
  ssl->s3->aead_write_ctx = std::move(aead_ctx);
  return true;
}